

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptTypes.h
# Opt level: O0

bool __thiscall MiniScript::Value::operator==(Value *this,Value *rhs)

{
  Value local_50 [2];
  Value local_30;
  Value *local_20;
  Value *rhs_local;
  Value *this_local;
  
  if (this->type == rhs->type) {
    local_20 = rhs;
    rhs_local = this;
    switch(this->type) {
    case Null:
      this_local._7_1_ = 1;
      break;
    case Number:
      this_local._7_1_ = (this->data).number == (rhs->data).number;
      break;
    case Temp:
      this_local._7_1_ = (this->data).tempNum == (rhs->data).tempNum;
      break;
    case String:
    case Var:
      if ((this->data).ref == (rhs->data).ref) {
        this_local._7_1_ = 1;
      }
      else if (((this->data).ref == (RefCountedStorage *)0x0) ||
              ((rhs->data).ref == (RefCountedStorage *)0x0)) {
        this_local._7_1_ = 0;
      }
      else {
        this_local._7_1_ = Equal((StringStorage *)(this->data).ref,(StringStorage *)(rhs->data).ref)
        ;
      }
      break;
    case List:
      if ((this->data).ref == (rhs->data).ref) {
        this_local._7_1_ = 1;
      }
      else if (((this->data).ref == (RefCountedStorage *)0x0) ||
              ((rhs->data).ref == (RefCountedStorage *)0x0)) {
        this_local._7_1_ = 0;
      }
      else {
        Value(&local_30,rhs);
        this_local._7_1_ = RecursiveEqual(this,&local_30);
        ~Value(&local_30);
      }
      break;
    case Map:
      if ((this->data).ref == (rhs->data).ref) {
        this_local._7_1_ = 1;
      }
      else if (((this->data).ref == (RefCountedStorage *)0x0) ||
              ((rhs->data).ref == (RefCountedStorage *)0x0)) {
        this_local._7_1_ = 0;
      }
      else {
        Value(local_50,rhs);
        this_local._7_1_ = RecursiveEqual(this,local_50);
        ~Value(local_50);
      }
      break;
    case Function:
      this_local._7_1_ = (this->data).ref == (rhs->data).ref;
      break;
    case SeqElem:
      if ((this->data).ref == (rhs->data).ref) {
        this_local._7_1_ = 1;
      }
      else if (((this->data).ref == (RefCountedStorage *)0x0) ||
              ((rhs->data).ref == (RefCountedStorage *)0x0)) {
        this_local._7_1_ = 0;
      }
      else {
        this_local._7_1_ =
             Equal((SeqElemStorage *)(this->data).ref,(SeqElemStorage *)(rhs->data).ref);
      }
      break;
    case Handle:
      this_local._7_1_ = (this->data).ref == (rhs->data).ref;
      break;
    default:
      this_local._7_1_ = 0;
    }
  }
  else {
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

inline bool Value::operator==(const Value& rhs) const {
		if (type != rhs.type) return false;
		switch (type) {
			case ValueType::Null:
				return true;		// null values are always equal
				
			case ValueType::Number:
				return data.number == rhs.data.number;
				
			case ValueType::String:
			case ValueType::Var:
			{
				if (data.ref == rhs.data.ref) return true;
				if (!data.ref || !rhs.data.ref) return false;
				return Equal((StringStorage*)data.ref, (StringStorage*)rhs.data.ref);
			}
			case ValueType::List:
			{
				if (data.ref == rhs.data.ref) return true;
				if (!data.ref || !rhs.data.ref) return false;
				return RecursiveEqual(rhs);
			}
			case ValueType::Map:
			{
				if (data.ref == rhs.data.ref) return true;
				if (!data.ref || !rhs.data.ref) return false;
				return RecursiveEqual(rhs);
			}
			case ValueType::Function:
				// Two functions are equal only if they refer to the exact same function
				return (data.ref == rhs.data.ref);

			case ValueType::Temp:
				return (data.tempNum == rhs.data.tempNum);
				
			case ValueType::SeqElem:
				if (data.ref == rhs.data.ref) return true;
				if (!data.ref || !rhs.data.ref) return false;
				return Equal((SeqElemStorage*)data.ref, (SeqElemStorage*)rhs.data.ref);
			
			case ValueType::Handle:
				return (data.ref == rhs.data.ref);
		}
		return false;
	}